

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Bucket __thiscall
QHashPrivate::Data<QHashPrivate::Node<QWidget*,QList<QGesture*>>>::findBucketWithHash<QWidget*>
          (Data<QHashPrivate::Node<QWidget*,QList<QGesture*>>> *this,QWidget **key,size_t hash)

{
  Span *pSVar1;
  bool bVar2;
  Span *pSVar3;
  Span *pSVar4;
  ulong uVar5;
  Bucket BVar6;
  
  pSVar1 = *(Span **)(this + 0x20);
  uVar5 = *(ulong *)(this + 0x10) - 1 & hash;
  pSVar4 = pSVar1 + (uVar5 >> 7);
  uVar5 = (ulong)((uint)uVar5 & 0x7f);
  do {
    if ((pSVar4->offsets[uVar5] == 0xff) ||
       (*(QWidget **)pSVar4->entries[pSVar4->offsets[uVar5]].storage.data == *key)) {
      bVar2 = false;
    }
    else {
      uVar5 = uVar5 + 1;
      bVar2 = true;
      if (uVar5 == 0x80) {
        pSVar3 = pSVar4 + 1;
        pSVar4 = pSVar1;
        if (((long)pSVar3 - (long)pSVar1 >> 4) * -0x71c71c71c71c71c7 -
            (*(ulong *)(this + 0x10) >> 7) != 0) {
          pSVar4 = pSVar3;
        }
        uVar5 = 0;
      }
    }
  } while (bVar2);
  BVar6.index = uVar5;
  BVar6.span = pSVar4;
  return BVar6;
}

Assistant:

Bucket findBucketWithHash(const K &key, size_t hash) const noexcept
    {
        static_assert(std::is_same_v<std::remove_cv_t<Key>, K> ||
                QHashHeterogeneousSearch<std::remove_cv_t<Key>, K>::value);
        Q_ASSERT(numBuckets > 0);
        Bucket bucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
        // loop over the buckets until we find the entry we search for
        // or an empty slot, in which case we know the entry doesn't exist
        while (true) {
            size_t offset = bucket.offset();
            if (offset == SpanConstants::UnusedEntry) {
                return bucket;
            } else {
                Node &n = bucket.nodeAtOffset(offset);
                if (qHashEquals(n.key, key))
                    return bucket;
            }
            bucket.advanceWrapped(this);
        }
    }